

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O3

char * GetPrevDirectoryPath(char *dirPath)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  memset(GetPrevDirectoryPath::prevDirPath,0,0x1000);
  sVar2 = strlen(dirPath);
  if ((int)(uint)sVar2 < 4) {
    pcVar3 = strcpy(GetPrevDirectoryPath::prevDirPath,dirPath);
    return pcVar3;
  }
  lVar5 = (ulong)((uint)sVar2 & 0x7fffffff) + 1;
  do {
    lVar4 = lVar5;
    lVar5 = lVar4 + -1;
    if (lVar5 < 1) {
      return GetPrevDirectoryPath::prevDirPath;
    }
  } while ((dirPath[lVar4 + -2] != '\\') && (dirPath[lVar4 + -2] != '/'));
  if ((int)lVar5 != 1) {
    if ((int)lVar5 == 3) {
      uVar1 = 2;
      if (dirPath[1] != ':') goto LAB_001237d9;
    }
    else {
      lVar5 = lVar4 + -2;
    }
  }
  uVar1 = (uint)lVar5;
LAB_001237d9:
  pcVar3 = strncpy(GetPrevDirectoryPath::prevDirPath,dirPath,(ulong)uVar1);
  return pcVar3;
}

Assistant:

const char *GetPrevDirectoryPath(const char *dirPath)
{
    static char prevDirPath[MAX_FILEPATH_LENGTH];
    memset(prevDirPath, 0, MAX_FILEPATH_LENGTH);
    int pathLen = (int)strlen(dirPath);

    if (pathLen <= 3) strcpy(prevDirPath, dirPath);

    for (int i = (pathLen - 1); (i >= 0) && (pathLen > 3); i--)
    {
        if ((dirPath[i] == '\\') || (dirPath[i] == '/'))
        {
            // Check for root: "C:\" or "/"
            if (((i == 2) && (dirPath[1] ==':')) || (i == 0)) i++;

            strncpy(prevDirPath, dirPath, i);
            break;
        }
    }

    return prevDirPath;
}